

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

CreateElementsSignatureHashTxIn * __thiscall
cfd::js::api::json::CreateElementsSignatureHashTxIn::GetConfidentialValueCommitmentString_abi_cxx11_
          (CreateElementsSignatureHashTxIn *this,CreateElementsSignatureHashTxIn *obj)

{
  CreateElementsSignatureHashTxIn *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->confidential_value_commitment_);
  return this;
}

Assistant:

static std::string GetConfidentialValueCommitmentString(  // line separate
      const CreateElementsSignatureHashTxIn& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.confidential_value_commitment_);
  }